

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standardplural.cpp
# Opt level: O0

int32_t icu_63::StandardPlural::indexOrNegativeFromString(UnicodeString *keyword)

{
  UnicodeString *pUVar1;
  int8_t iVar2;
  int32_t iVar3;
  ConstChar16Ptr local_58;
  ConstChar16Ptr local_50;
  ConstChar16Ptr local_48;
  ConstChar16Ptr local_40;
  ConstChar16Ptr local_38 [3];
  ConstChar16Ptr local_20;
  UnicodeString *local_18;
  UnicodeString *keyword_local;
  
  local_18 = keyword;
  iVar3 = icu_63::UnicodeString::length(keyword);
  pUVar1 = local_18;
  if (iVar3 == 3) {
    ConstChar16Ptr::ConstChar16Ptr(&local_20,L"onetwofewmanyzeroother睴o敦w慭祮漀桴牥");
    iVar2 = icu_63::UnicodeString::compare(pUVar1,&local_20,3);
    ConstChar16Ptr::~ConstChar16Ptr(&local_20);
    pUVar1 = local_18;
    if (iVar2 == '\0') {
      return 1;
    }
    ConstChar16Ptr::ConstChar16Ptr(local_38,L"twofewmanyzeroother睴o敦w慭祮漀桴牥");
    iVar2 = icu_63::UnicodeString::compare(pUVar1,local_38,3);
    ConstChar16Ptr::~ConstChar16Ptr(local_38);
    pUVar1 = local_18;
    if (iVar2 == '\0') {
      return 2;
    }
    ConstChar16Ptr::ConstChar16Ptr(&local_40,L"fewmanyzeroother睴o敦w慭祮漀桴牥");
    iVar2 = icu_63::UnicodeString::compare(pUVar1,&local_40,3);
    ConstChar16Ptr::~ConstChar16Ptr(&local_40);
    if (iVar2 == '\0') {
      return 3;
    }
  }
  else if (iVar3 == 4) {
    ConstChar16Ptr::ConstChar16Ptr(&local_48,L"manyzeroother睴o敦w慭祮漀桴牥");
    iVar2 = icu_63::UnicodeString::compare(pUVar1,&local_48,4);
    ConstChar16Ptr::~ConstChar16Ptr(&local_48);
    pUVar1 = local_18;
    if (iVar2 == '\0') {
      return 4;
    }
    ConstChar16Ptr::ConstChar16Ptr(&local_50,L"zeroother睴o敦w慭祮漀桴牥");
    iVar2 = icu_63::UnicodeString::compare(pUVar1,&local_50,4);
    ConstChar16Ptr::~ConstChar16Ptr(&local_50);
    if (iVar2 == '\0') {
      return 0;
    }
  }
  else if (iVar3 == 5) {
    ConstChar16Ptr::ConstChar16Ptr(&local_58,(char16_t *)gOther);
    iVar2 = icu_63::UnicodeString::compare(pUVar1,&local_58,5);
    ConstChar16Ptr::~ConstChar16Ptr(&local_58);
    if (iVar2 == '\0') {
      return 5;
    }
  }
  return -1;
}

Assistant:

int32_t StandardPlural::indexOrNegativeFromString(const UnicodeString &keyword) {
    switch (keyword.length()) {
    case 3:
        if (keyword.compare(gOne, 3) == 0) {
            return ONE;
        } else if (keyword.compare(gTwo, 3) == 0) {
            return TWO;
        } else if (keyword.compare(gFew, 3) == 0) {
            return FEW;
        }
        break;
    case 4:
        if (keyword.compare(gMany, 4) == 0) {
            return MANY;
        } else if (keyword.compare(gZero, 4) == 0) {
            return ZERO;
        }
        break;
    case 5:
        if (keyword.compare(gOther, 5) == 0) {
            return OTHER;
        }
        break;
    default:
        break;
    }
    return -1;
}